

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

void __thiscall
MT32Emu::BReverbModelImpl<short>::setParameters
          (BReverbModelImpl<short> *this,Bit8u time,Bit8u level)

{
  TapDelayCombFilter<short> *this_00;
  uint uVar1;
  byte bVar2;
  byte bVar3;
  uint local_24;
  Bit32u i;
  TapDelayCombFilter<short> *comb;
  Bit8u level_local;
  Bit8u time_local;
  BReverbModelImpl<short> *this_local;
  
  uVar1 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((uVar1 & 1) != 0) {
    bVar2 = level & 7;
    bVar3 = time & 7;
    if ((this->tapDelayMode & 1U) == 0) {
      for (local_24 = 1; local_24 < this->currentSettings->numberOfCombs; local_24 = local_24 + 1) {
        CombFilter<short>::setFeedbackFactor
                  (this->combs[local_24],
                   this->currentSettings->feedbackFactors[local_24 * 8 + (uint)bVar3]);
      }
    }
    else {
      this_00 = (TapDelayCombFilter<short> *)*this->combs;
      TapDelayCombFilter<short>::setOutputPositions
                (this_00,this->currentSettings->outLPositions[bVar3],
                 this->currentSettings->outRPositions[(int)(uint)bVar3]);
      CombFilter<short>::setFeedbackFactor
                ((CombFilter<short> *)this_00,
                 this->currentSettings->feedbackFactors[(int)(uint)(2 < bVar2 && 5 < bVar3)]);
    }
    if ((bVar3 == 0) && (bVar2 == 0)) {
      this->wetLevel = '\0';
      this->dryAmp = '\0';
    }
    else {
      if (((this->tapDelayMode & 1U) == 0) || ((bVar3 != 0 && ((bVar3 != 1 || (bVar2 != 1)))))) {
        this->dryAmp = this->currentSettings->dryAmps[bVar2];
      }
      else {
        this->dryAmp = this->currentSettings->dryAmps[(int)(bVar2 + 8)];
      }
      this->wetLevel = this->currentSettings->wetLevels[bVar2];
    }
  }
  return;
}

Assistant:

void setParameters(Bit8u time, Bit8u level) {
		if (!isOpen()) return;
		level &= 7;
		time &= 7;
		if (tapDelayMode) {
			TapDelayCombFilter<Sample> *comb = static_cast<TapDelayCombFilter<Sample> *> (*combs);
			comb->setOutputPositions(currentSettings.outLPositions[time], currentSettings.outRPositions[time & 7]);
			comb->setFeedbackFactor(currentSettings.feedbackFactors[((level < 3) || (time < 6)) ? 0 : 1]);
		} else {
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i]->setFeedbackFactor(currentSettings.feedbackFactors[(i << 3) + time]);
			}
		}
		if (time == 0 && level == 0) {
			dryAmp = wetLevel = 0;
		} else {
			if (tapDelayMode && ((time == 0) || (time == 1 && level == 1))) {
				// Looks like MT-32 implementation has some minor quirks in this mode:
				// for odd level values, the output level changes sometimes depending on the time value which doesn't seem right.
				dryAmp = currentSettings.dryAmps[level + 8];
			} else {
				dryAmp = currentSettings.dryAmps[level];
			}
			wetLevel = currentSettings.wetLevels[level];
		}
	}